

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

void console_open(FILE **outfp,int *infd)

{
  int iVar1;
  FILE *pFVar2;
  int fd;
  int *infd_local;
  FILE **outfp_local;
  
  iVar1 = open("/dev/tty",2);
  if (iVar1 < 0) {
    *infd = 0;
    *outfp = _stderr;
  }
  else {
    *infd = iVar1;
    pFVar2 = fdopen(*infd,"w");
    *outfp = (FILE *)pFVar2;
  }
  return;
}

Assistant:

static void console_open(FILE **outfp, int *infd)
{
    int fd;

    if ((fd = open("/dev/tty", O_RDWR)) >= 0) {
        *infd = fd;
        *outfp = fdopen(*infd, "w");
    } else {
        *infd = 0;
        *outfp = stderr;
    }
}